

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void crypto_stream_receive(quicly_stream_t *stream,size_t off,void *src,size_t len)

{
  quicly_conn_t *conn;
  ulong uVar1;
  st_quicly_application_space_t *psVar2;
  ptls_aead_context_t *ctx;
  int iVar3;
  uint err;
  size_t inlen;
  ptls_iovec_t pVar4;
  size_t epoch_offsets [5];
  ptls_buffer_t local_78;
  size_t local_58 [5];
  
  conn = stream->conn;
  uVar1 = stream->stream_id;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[4] = 0;
  iVar3 = quicly_streambuf_ingress_receive(stream,off,src,len);
  if (iVar3 == 0) {
    local_78.base = "";
    local_78.capacity = 0;
    local_78.off = 0;
    local_78._24_8_ = (ulong)(uint)local_78._28_4_ << 0x20;
    do {
      pVar4 = quicly_recvbuf_get(stream,(ptls_buffer_t *)((long)stream->data + 0x28));
      inlen = pVar4.len;
      if (inlen == 0) {
        write_crypto_data(conn,&local_78,local_58);
        goto LAB_001249fe;
      }
      err = ptls_handle_message((conn->crypto).tls,&local_78,local_58,~uVar1,pVar4.base,inlen,
                                &(conn->crypto).handshake_properties);
      quicly_recvbuf_shift(stream,(ptls_buffer_t *)((long)stream->data + 0x28),inlen);
      if ((err == 0) || (err == 0x202)) {
        psVar2 = conn->application;
        if ((psVar2 != (st_quicly_application_space_t *)0x0) &&
           ((psVar2->one_rtt_writable == 0 &&
            (ctx = (psVar2->cipher).egress.key.aead, ctx != (ptls_aead_context_t *)0x0)))) {
          if (((conn->super).local.bidi.next_stream_id & 1) != 0) {
            __assert_fail("quicly_is_client(conn)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0x3d6,
                          "void crypto_stream_receive(quicly_stream_t *, size_t, const void *, size_t)"
                         );
          }
          if ((conn->crypto).handshake_properties.field_0.client.early_data_acceptance ==
              PTLS_EARLY_DATA_REJECTED) {
            ptls_aead_free(ctx);
            ptls_cipher_free((psVar2->cipher).egress.key.header_protection);
            psVar2 = conn->application;
            (psVar2->cipher).egress.key.aead = (ptls_aead_context_t *)0x0;
            (psVar2->cipher).egress.key.header_protection = (ptls_cipher_context_t *)0x0;
            iVar3 = discard_sentmap_by_epoch(conn,8);
            if (iVar3 != 0) {
              initiate_close(conn,iVar3,6,(char *)0x0);
              iVar3 = 5;
              goto LAB_00124961;
            }
          }
        }
        iVar3 = 0;
      }
      else {
        if (0xff < err) {
          err = 0x20001;
        }
        initiate_close(conn,err,6,(char *)0x0);
        iVar3 = 5;
      }
LAB_00124961:
    } while (iVar3 == 0);
    if (iVar3 == 5) {
LAB_001249fe:
      ptls_buffer__release_memory(&local_78);
    }
  }
  return;
}

Assistant:

void crypto_stream_receive(quicly_stream_t *stream, size_t off, const void *src, size_t len)
{
    quicly_conn_t *conn = stream->conn;
    size_t in_epoch = -(1 + stream->stream_id), epoch_offsets[5] = {0};
    ptls_iovec_t input;
    ptls_buffer_t output;

    if (quicly_streambuf_ingress_receive(stream, off, src, len) != 0)
        return;

    ptls_buffer_init(&output, "", 0);

    /* send handshake messages to picotls, and let it fill in the response */
    while ((input = quicly_streambuf_ingress_get(stream)).len != 0) {
        int handshake_result = ptls_handle_message(conn->crypto.tls, &output, epoch_offsets, in_epoch, input.base, input.len,
                                                   &conn->crypto.handshake_properties);
        quicly_streambuf_ingress_shift(stream, input.len);
        QUICLY_PROBE(CRYPTO_HANDSHAKE, conn, conn->stash.now, handshake_result);
        switch (handshake_result) {
        case 0:
        case PTLS_ERROR_IN_PROGRESS:
            break;
        default:
            initiate_close(conn,
                           PTLS_ERROR_GET_CLASS(handshake_result) == PTLS_ERROR_CLASS_SELF_ALERT ? handshake_result
                                                                                                 : QUICLY_TRANSPORT_ERROR_INTERNAL,
                           QUICLY_FRAME_TYPE_CRYPTO, NULL);
            goto Exit;
        }
        /* drop 0-RTT write key if 0-RTT is rejected by remote peer */
        if (conn->application != NULL && !conn->application->one_rtt_writable &&
            conn->application->cipher.egress.key.aead != NULL) {
            assert(quicly_is_client(conn));
            if (conn->crypto.handshake_properties.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED) {
                dispose_cipher(&conn->application->cipher.egress.key);
                conn->application->cipher.egress.key = (struct st_quicly_cipher_context_t){NULL};
                /* retire all packets with ack_epoch == 3; they are all 0-RTT packets */
                int ret;
                if ((ret = discard_sentmap_by_epoch(conn, 1u << QUICLY_EPOCH_1RTT)) != 0) {
                    initiate_close(conn, ret, QUICLY_FRAME_TYPE_CRYPTO, NULL);
                    goto Exit;
                }
            }
        }
    }
    write_crypto_data(conn, &output, epoch_offsets);

Exit:
    ptls_buffer_dispose(&output);
}